

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Sprs_array_col_block_list(int s_a,int **idx,int *n)

{
  int *piVar1;
  long lVar2;
  Integer *Idx;
  Integer N;
  Integer *local_28;
  long local_20;
  
  pnga_sprs_array_col_block_list((long)s_a,&local_28,&local_20);
  *n = (int)local_20;
  piVar1 = (int *)malloc(local_20 * 4);
  *idx = piVar1;
  if (0 < local_20) {
    lVar2 = 0;
    do {
      piVar1[lVar2] = (int)local_28[lVar2];
      lVar2 = lVar2 + 1;
    } while (local_20 != lVar2);
  }
  free(local_28);
  return;
}

Assistant:

void NGA_Sprs_array_col_block_list(int s_a, int **idx, int *n)
{
  Integer *Idx;
  Integer i,N;
  Integer sa = s_a;
  wnga_sprs_array_col_block_list(sa, &Idx, &N);
  *n = N;
  *idx = (int*)malloc(N*sizeof(int));
  for (i=0; i<N; i++) {
    (*idx)[i] = (int)(Idx[i]);
  }
  free(Idx);
}